

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qglobal.cpp
# Opt level: O2

uint qt_int_sqrt(uint n)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  
  if (n < 0x3fffffff) {
    uVar1 = 1;
    do {
      uVar2 = uVar1;
      uVar1 = uVar2 * 4;
    } while (uVar2 <= n);
    uVar1 = 0;
    while (uVar2 != 1) {
      uVar2 = uVar2 >> 2;
      uVar3 = uVar2 + uVar1;
      uVar4 = uVar2;
      if (n < uVar3) {
        uVar4 = 0;
        uVar3 = 0;
      }
      uVar1 = uVar4 + (uVar1 >> 1);
      n = n - uVar3;
    }
  }
  else {
    uVar1 = qt_int_sqrt(n >> 2);
    uVar2 = uVar1 * 2 + 1;
    uVar1 = uVar1 * 2;
    if (uVar2 * uVar2 <= n) {
      uVar1 = uVar2;
    }
  }
  return uVar1;
}

Assistant:

Q_CORE_EXPORT Q_DECL_CONST_FUNCTION unsigned int qt_int_sqrt(unsigned int n)
{
    // n must be in the range 0...UINT_MAX/2-1
    if (n >= (UINT_MAX >> 2)) {
        unsigned int r = 2 * qt_int_sqrt(n / 4);
        unsigned int r2 = r + 1;
        return (n >= r2 * r2) ? r2 : r;
    }
    uint h, p = 0, q = 1, r = n;
    while (q <= n)
        q <<= 2;
    while (q != 1) {
        q >>= 2;
        h = p + q;
        p >>= 1;
        if (r >= h) {
            p += q;
            r -= h;
        }
    }
    return p;
}